

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

void jp2_write_jp2h(opj_jp2_t *jp2,opj_cio_t *cio)

{
  int pos;
  int iVar1;
  opj_jp2_t *in_RSI;
  long in_RDI;
  opj_jp2_box_t box;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  pos = cio_tell((opj_cio_t *)in_RSI);
  cio_skip((opj_cio_t *)in_RSI,4);
  cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8),
            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
  ;
  jp2_write_ihdr(in_RSI,(opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8));
  if (*(int *)(in_RDI + 0x1c) == 0xff) {
    jp2_write_bpcc(in_RSI,(opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8));
  }
  jp2_write_colr_orig(in_RSI,(opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8));
  iVar1 = cio_tell((opj_cio_t *)in_RSI);
  iVar1 = iVar1 - pos;
  cio_seek((opj_cio_t *)in_RSI,pos);
  cio_write((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffe8),
            CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  cio_seek((opj_cio_t *)in_RSI,pos + iVar1);
  return;
}

Assistant:

void jp2_write_jp2h(opj_jp2_t *jp2, opj_cio_t *cio) {
	opj_jp2_box_t box;

	box.init_pos = cio_tell(cio);
	cio_skip(cio, 4);
	cio_write(cio, JP2_JP2H, 4);	/* JP2H */

	jp2_write_ihdr(jp2, cio);

	if (jp2->bpc == 255) {
		jp2_write_bpcc(jp2, cio);
	}
	jp2_write_colr_orig(jp2, cio);

	box.length = cio_tell(cio) - box.init_pos;
	cio_seek(cio, box.init_pos);
	cio_write(cio, box.length, 4);	/* L */
	cio_seek(cio, box.init_pos + box.length);
}